

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

char * __thiscall
google::protobuf::ExtensionRangeOptions::_InternalParse
          (ExtensionRangeOptions *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  ParseContext *pPVar2;
  ParseContext *in_RDX;
  char *in_RSI;
  InternalMetadataWithArena *in_RDI;
  Message *unaff_retaddr;
  char *in_stack_00000008;
  uint64 in_stack_00000010;
  ExtensionSet *in_stack_00000018;
  uint32 tag;
  Arena *arena;
  char **in_stack_ffffffffffffffa8;
  ParseContext *in_stack_ffffffffffffffb0;
  ParseContext *in_stack_ffffffffffffffb8;
  ParseContext *in_stack_ffffffffffffffc0;
  ParseContext *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  ParseContext *ctx_00;
  InternalMetadataWithArena *metadata;
  
  metadata = in_RDI;
  GetArenaNoVirtual((ExtensionRangeOptions *)in_stack_ffffffffffffffb0);
  while( true ) {
    bVar1 = internal::ParseContext::Done(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return in_RSI;
    }
    pPVar2 = (ParseContext *)
             internal::ReadTag((char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
                               ,(uint32 *)in_RDI,(uint32)((ulong)in_stack_ffffffffffffffc8 >> 0x20))
    ;
    if (pPVar2 == (ParseContext *)0x0) break;
    if ((in_stack_ffffffffffffffdc >> 3 == 999) && ((in_stack_ffffffffffffffdc & 0xff) == 0x3a)) {
      do {
        in_stack_ffffffffffffffc8 = in_RDX;
        _internal_add_uninterpreted_option((ExtensionRangeOptions *)0x508ccb);
        in_RSI = internal::ParseContext::ParseMessage<google::protobuf::UninterpretedOption>
                           (in_stack_ffffffffffffffc8,
                            (UninterpretedOption *)in_stack_ffffffffffffffc0,
                            (char *)in_stack_ffffffffffffffb8);
        if (in_RSI == (char *)0x0) {
          return (char *)0x0;
        }
        bVar1 = internal::EpsCopyInputStream::DataAvailable
                          (&in_RDX->super_EpsCopyInputStream,in_RSI);
      } while ((bVar1) && (bVar1 = internal::ExpectTag<7994u>(in_RSI), bVar1));
    }
    else {
      if (((in_stack_ffffffffffffffdc & 7) == 4) || (in_stack_ffffffffffffffdc == 0)) {
        internal::EpsCopyInputStream::SetLastTag
                  (&in_RDX->super_EpsCopyInputStream,in_stack_ffffffffffffffdc);
        return (char *)pPVar2;
      }
      if (in_stack_ffffffffffffffdc < 8000) {
        in_RSI = internal::UnknownFieldParse
                           ((uint32)((ulong)in_RDI >> 0x20),
                            (InternalMetadataWithArena *)in_stack_ffffffffffffffc8,
                            (char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        if (in_RSI == (char *)0x0) {
          return (char *)0x0;
        }
      }
      else {
        in_stack_ffffffffffffffb0 = (ParseContext *)(in_RDI + 1);
        in_stack_ffffffffffffffb8 = (ParseContext *)(ulong)in_stack_ffffffffffffffdc;
        ctx_00 = pPVar2;
        internal_default_instance();
        in_RSI = internal::ExtensionSet::ParseField
                           (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
                            metadata,ctx_00);
        in_stack_ffffffffffffffc0 = pPVar2;
        if (in_RSI == (char *)0x0) {
          return (char *)0x0;
        }
      }
    }
  }
  return (char *)0x0;
}

Assistant:

const char* ExtensionRangeOptions::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr -= 2;
          do {
            ptr += 2;
            ptr = ctx->ParseMessage(_internal_add_uninterpreted_option(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<7994>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((8000u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}